

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlst.cpp
# Opt level: O1

char * CVmObjList::list_to_string(vm_val_t *retval,vm_val_t *self,int radix,int flags)

{
  ushort uVar1;
  CVmObjPageEntry *pCVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  anon_union_8_8_cb74652f_for_val aVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  vm_val_t *pvVar33;
  vm_val_t *pvVar34;
  uint uVar35;
  char *pcVar36;
  ushort *puVar37;
  long lVar38;
  ulong uVar39;
  undefined1 auVar40 [16];
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qb;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  int iVar60;
  int iVar63;
  int iVar64;
  undefined1 auVar61 [16];
  int iVar65;
  undefined1 auVar62 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  int iVar79;
  int iVar83;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  vm_val_t newlstval;
  vm_val_t newele;
  vm_val_t ele;
  vm_val_t local_70;
  vm_val_t *local_60;
  long *local_58;
  vm_val_t local_50;
  vm_val_t local_40;
  
  local_60 = retval;
  uVar35 = vm_val_t::ll_length(self);
  local_70.val.obj = create(0,(long)(int)uVar35);
  local_70.typ = VM_OBJ;
  (**(code **)(*(long *)&G_obj_table_X.pages_[local_70.val.obj >> 0xc][local_70.val.obj & 0xfff].
                         ptr_ + 8))
            (G_obj_table_X.pages_[local_70.val.obj >> 0xc] + (local_70.val.obj & 0xfff),
             metaclass_reg_);
  auVar32 = _DAT_002ca730;
  auVar31 = _DAT_002ca720;
  auVar30 = _DAT_002ca710;
  auVar29 = _DAT_002ca700;
  auVar28 = _DAT_00299d30;
  auVar27 = _DAT_00299d20;
  auVar26 = _DAT_00299670;
  auVar41._8_8_ = extraout_XMM1_Qb;
  auVar41._0_8_ = extraout_XMM1_Qa;
  pCVar2 = G_obj_table_X.pages_[local_70.val.obj >> 0xc];
  puVar37 = *(ushort **)((long)&pCVar2[local_70.val.obj & 0xfff].ptr_ + 8);
  uVar1 = *puVar37;
  if ((ulong)uVar1 != 0) {
    puVar37 = puVar37 + 1;
    lVar38 = (ulong)uVar1 - 1;
    auVar40._8_4_ = (int)lVar38;
    auVar40._0_8_ = lVar38;
    auVar40._12_4_ = (int)((ulong)lVar38 >> 0x20);
    uVar39 = 0;
    do {
      auVar58._8_4_ = (int)uVar39;
      auVar58._0_8_ = uVar39;
      auVar58._12_4_ = (int)(uVar39 >> 0x20);
      auVar61 = auVar40 ^ auVar28;
      auVar66 = (auVar58 | auVar26) ^ auVar28;
      iVar60 = auVar61._0_4_;
      iVar79 = -(uint)(iVar60 < auVar66._0_4_);
      iVar63 = auVar61._4_4_;
      auVar68._4_4_ = -(uint)(iVar63 < auVar66._4_4_);
      iVar64 = auVar61._8_4_;
      iVar83 = -(uint)(iVar64 < auVar66._8_4_);
      iVar65 = auVar61._12_4_;
      auVar68._12_4_ = -(uint)(iVar65 < auVar66._12_4_);
      auVar42._4_4_ = iVar79;
      auVar42._0_4_ = iVar79;
      auVar42._8_4_ = iVar83;
      auVar42._12_4_ = iVar83;
      auVar41 = pshuflw(auVar41,auVar42,0xe8);
      auVar67._4_4_ = -(uint)(auVar66._4_4_ == iVar63);
      auVar67._12_4_ = -(uint)(auVar66._12_4_ == iVar65);
      auVar67._0_4_ = auVar67._4_4_;
      auVar67._8_4_ = auVar67._12_4_;
      auVar66 = pshuflw(in_XMM2,auVar67,0xe8);
      auVar68._0_4_ = auVar68._4_4_;
      auVar68._8_4_ = auVar68._12_4_;
      auVar42 = pshuflw(auVar41,auVar68,0xe8);
      auVar61._8_4_ = 0xffffffff;
      auVar61._0_8_ = 0xffffffffffffffff;
      auVar61._12_4_ = 0xffffffff;
      auVar61 = (auVar42 | auVar66 & auVar41) ^ auVar61;
      auVar41 = packssdw(auVar61,auVar61);
      if ((auVar41 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(undefined1 *)puVar37 = 1;
      }
      auVar12._4_4_ = iVar79;
      auVar12._0_4_ = iVar79;
      auVar12._8_4_ = iVar83;
      auVar12._12_4_ = iVar83;
      auVar68 = auVar67 & auVar12 | auVar68;
      auVar41 = packssdw(auVar68,auVar68);
      auVar66._8_4_ = 0xffffffff;
      auVar66._0_8_ = 0xffffffffffffffff;
      auVar66._12_4_ = 0xffffffff;
      auVar41 = packssdw(auVar41 ^ auVar66,auVar41 ^ auVar66);
      auVar41 = packsswb(auVar41,auVar41);
      if ((auVar41._0_4_ >> 8 & 1) != 0) {
        *(undefined1 *)((long)puVar37 + 5) = 1;
      }
      auVar41 = (auVar58 | auVar27) ^ auVar28;
      auVar51._0_4_ = -(uint)(iVar60 < auVar41._0_4_);
      auVar51._4_4_ = -(uint)(iVar63 < auVar41._4_4_);
      auVar51._8_4_ = -(uint)(iVar64 < auVar41._8_4_);
      auVar51._12_4_ = -(uint)(iVar65 < auVar41._12_4_);
      auVar69._4_4_ = auVar51._0_4_;
      auVar69._0_4_ = auVar51._0_4_;
      auVar69._8_4_ = auVar51._8_4_;
      auVar69._12_4_ = auVar51._8_4_;
      iVar79 = -(uint)(auVar41._4_4_ == iVar63);
      iVar83 = -(uint)(auVar41._12_4_ == iVar65);
      auVar13._4_4_ = iVar79;
      auVar13._0_4_ = iVar79;
      auVar13._8_4_ = iVar83;
      auVar13._12_4_ = iVar83;
      auVar80._4_4_ = auVar51._4_4_;
      auVar80._0_4_ = auVar51._4_4_;
      auVar80._8_4_ = auVar51._12_4_;
      auVar80._12_4_ = auVar51._12_4_;
      auVar41 = auVar13 & auVar69 | auVar80;
      auVar41 = packssdw(auVar41,auVar41);
      auVar3._8_4_ = 0xffffffff;
      auVar3._0_8_ = 0xffffffffffffffff;
      auVar3._12_4_ = 0xffffffff;
      auVar41 = packssdw(auVar41 ^ auVar3,auVar41 ^ auVar3);
      auVar41 = packsswb(auVar41,auVar41);
      if ((auVar41._0_4_ >> 0x10 & 1) != 0) {
        *(undefined1 *)(puVar37 + 5) = 1;
      }
      auVar41 = pshufhw(auVar41,auVar69,0x84);
      auVar14._4_4_ = iVar79;
      auVar14._0_4_ = iVar79;
      auVar14._8_4_ = iVar83;
      auVar14._12_4_ = iVar83;
      auVar42 = pshufhw(auVar51,auVar14,0x84);
      auVar61 = pshufhw(auVar41,auVar80,0x84);
      auVar43._8_4_ = 0xffffffff;
      auVar43._0_8_ = 0xffffffffffffffff;
      auVar43._12_4_ = 0xffffffff;
      auVar43 = (auVar61 | auVar42 & auVar41) ^ auVar43;
      auVar41 = packssdw(auVar43,auVar43);
      auVar41 = packsswb(auVar41,auVar41);
      if ((auVar41._0_4_ >> 0x18 & 1) != 0) {
        *(undefined1 *)((long)puVar37 + 0xf) = 1;
      }
      auVar41 = (auVar58 | auVar32) ^ auVar28;
      auVar52._0_4_ = -(uint)(iVar60 < auVar41._0_4_);
      auVar52._4_4_ = -(uint)(iVar63 < auVar41._4_4_);
      auVar52._8_4_ = -(uint)(iVar64 < auVar41._8_4_);
      auVar52._12_4_ = -(uint)(iVar65 < auVar41._12_4_);
      auVar15._4_4_ = auVar52._0_4_;
      auVar15._0_4_ = auVar52._0_4_;
      auVar15._8_4_ = auVar52._8_4_;
      auVar15._12_4_ = auVar52._8_4_;
      auVar42 = pshuflw(auVar80,auVar15,0xe8);
      auVar44._0_4_ = -(uint)(auVar41._0_4_ == iVar60);
      auVar44._4_4_ = -(uint)(auVar41._4_4_ == iVar63);
      auVar44._8_4_ = -(uint)(auVar41._8_4_ == iVar64);
      auVar44._12_4_ = -(uint)(auVar41._12_4_ == iVar65);
      auVar70._4_4_ = auVar44._4_4_;
      auVar70._0_4_ = auVar44._4_4_;
      auVar70._8_4_ = auVar44._12_4_;
      auVar70._12_4_ = auVar44._12_4_;
      auVar41 = pshuflw(auVar44,auVar70,0xe8);
      auVar71._4_4_ = auVar52._4_4_;
      auVar71._0_4_ = auVar52._4_4_;
      auVar71._8_4_ = auVar52._12_4_;
      auVar71._12_4_ = auVar52._12_4_;
      auVar61 = pshuflw(auVar52,auVar71,0xe8);
      auVar4._8_4_ = 0xffffffff;
      auVar4._0_8_ = 0xffffffffffffffff;
      auVar4._12_4_ = 0xffffffff;
      auVar41 = packssdw(auVar41 & auVar42,(auVar61 | auVar41 & auVar42) ^ auVar4);
      auVar41 = packsswb(auVar41,auVar41);
      if ((auVar41 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(undefined1 *)(puVar37 + 10) = 1;
      }
      auVar16._4_4_ = auVar52._0_4_;
      auVar16._0_4_ = auVar52._0_4_;
      auVar16._8_4_ = auVar52._8_4_;
      auVar16._12_4_ = auVar52._8_4_;
      auVar71 = auVar70 & auVar16 | auVar71;
      auVar61 = packssdw(auVar71,auVar71);
      auVar5._8_4_ = 0xffffffff;
      auVar5._0_8_ = 0xffffffffffffffff;
      auVar5._12_4_ = 0xffffffff;
      auVar41 = packssdw(auVar41,auVar61 ^ auVar5);
      auVar41 = packsswb(auVar41,auVar41);
      if ((auVar41._4_2_ >> 8 & 1) != 0) {
        *(undefined1 *)((long)puVar37 + 0x19) = 1;
      }
      auVar41 = (auVar58 | auVar31) ^ auVar28;
      auVar53._0_4_ = -(uint)(iVar60 < auVar41._0_4_);
      auVar53._4_4_ = -(uint)(iVar63 < auVar41._4_4_);
      auVar53._8_4_ = -(uint)(iVar64 < auVar41._8_4_);
      auVar53._12_4_ = -(uint)(iVar65 < auVar41._12_4_);
      auVar72._4_4_ = auVar53._0_4_;
      auVar72._0_4_ = auVar53._0_4_;
      auVar72._8_4_ = auVar53._8_4_;
      auVar72._12_4_ = auVar53._8_4_;
      iVar79 = -(uint)(auVar41._4_4_ == iVar63);
      iVar83 = -(uint)(auVar41._12_4_ == iVar65);
      auVar17._4_4_ = iVar79;
      auVar17._0_4_ = iVar79;
      auVar17._8_4_ = iVar83;
      auVar17._12_4_ = iVar83;
      auVar81._4_4_ = auVar53._4_4_;
      auVar81._0_4_ = auVar53._4_4_;
      auVar81._8_4_ = auVar53._12_4_;
      auVar81._12_4_ = auVar53._12_4_;
      auVar41 = auVar17 & auVar72 | auVar81;
      auVar41 = packssdw(auVar41,auVar41);
      auVar6._8_4_ = 0xffffffff;
      auVar6._0_8_ = 0xffffffffffffffff;
      auVar6._12_4_ = 0xffffffff;
      auVar41 = packssdw(auVar41 ^ auVar6,auVar41 ^ auVar6);
      auVar41 = packsswb(auVar41,auVar41);
      if ((auVar41 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(undefined1 *)(puVar37 + 0xf) = 1;
      }
      auVar41 = pshufhw(auVar41,auVar72,0x84);
      auVar18._4_4_ = iVar79;
      auVar18._0_4_ = iVar79;
      auVar18._8_4_ = iVar83;
      auVar18._12_4_ = iVar83;
      auVar42 = pshufhw(auVar53,auVar18,0x84);
      auVar61 = pshufhw(auVar41,auVar81,0x84);
      auVar45._8_4_ = 0xffffffff;
      auVar45._0_8_ = 0xffffffffffffffff;
      auVar45._12_4_ = 0xffffffff;
      auVar45 = (auVar61 | auVar42 & auVar41) ^ auVar45;
      auVar41 = packssdw(auVar45,auVar45);
      auVar41 = packsswb(auVar41,auVar41);
      if ((auVar41._6_2_ >> 8 & 1) != 0) {
        *(undefined1 *)((long)puVar37 + 0x23) = 1;
      }
      auVar41 = (auVar58 | auVar30) ^ auVar28;
      auVar54._0_4_ = -(uint)(iVar60 < auVar41._0_4_);
      auVar54._4_4_ = -(uint)(iVar63 < auVar41._4_4_);
      auVar54._8_4_ = -(uint)(iVar64 < auVar41._8_4_);
      auVar54._12_4_ = -(uint)(iVar65 < auVar41._12_4_);
      auVar19._4_4_ = auVar54._0_4_;
      auVar19._0_4_ = auVar54._0_4_;
      auVar19._8_4_ = auVar54._8_4_;
      auVar19._12_4_ = auVar54._8_4_;
      auVar42 = pshuflw(auVar81,auVar19,0xe8);
      auVar46._0_4_ = -(uint)(auVar41._0_4_ == iVar60);
      auVar46._4_4_ = -(uint)(auVar41._4_4_ == iVar63);
      auVar46._8_4_ = -(uint)(auVar41._8_4_ == iVar64);
      auVar46._12_4_ = -(uint)(auVar41._12_4_ == iVar65);
      auVar73._4_4_ = auVar46._4_4_;
      auVar73._0_4_ = auVar46._4_4_;
      auVar73._8_4_ = auVar46._12_4_;
      auVar73._12_4_ = auVar46._12_4_;
      auVar41 = pshuflw(auVar46,auVar73,0xe8);
      auVar74._4_4_ = auVar54._4_4_;
      auVar74._0_4_ = auVar54._4_4_;
      auVar74._8_4_ = auVar54._12_4_;
      auVar74._12_4_ = auVar54._12_4_;
      auVar61 = pshuflw(auVar54,auVar74,0xe8);
      auVar55._8_4_ = 0xffffffff;
      auVar55._0_8_ = 0xffffffffffffffff;
      auVar55._12_4_ = 0xffffffff;
      auVar55 = (auVar61 | auVar41 & auVar42) ^ auVar55;
      auVar61 = packssdw(auVar55,auVar55);
      auVar41 = packsswb(auVar41 & auVar42,auVar61);
      if ((auVar41 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(undefined1 *)(puVar37 + 0x14) = 1;
      }
      auVar20._4_4_ = auVar54._0_4_;
      auVar20._0_4_ = auVar54._0_4_;
      auVar20._8_4_ = auVar54._8_4_;
      auVar20._12_4_ = auVar54._8_4_;
      auVar74 = auVar73 & auVar20 | auVar74;
      auVar61 = packssdw(auVar74,auVar74);
      auVar7._8_4_ = 0xffffffff;
      auVar7._0_8_ = 0xffffffffffffffff;
      auVar7._12_4_ = 0xffffffff;
      auVar61 = packssdw(auVar61 ^ auVar7,auVar61 ^ auVar7);
      auVar41 = packsswb(auVar41,auVar61);
      if ((auVar41._8_2_ >> 8 & 1) != 0) {
        *(undefined1 *)((long)puVar37 + 0x2d) = 1;
      }
      auVar41 = (auVar58 | auVar29) ^ auVar28;
      auVar56._0_4_ = -(uint)(iVar60 < auVar41._0_4_);
      auVar56._4_4_ = -(uint)(iVar63 < auVar41._4_4_);
      auVar56._8_4_ = -(uint)(iVar64 < auVar41._8_4_);
      auVar56._12_4_ = -(uint)(iVar65 < auVar41._12_4_);
      auVar75._4_4_ = auVar56._0_4_;
      auVar75._0_4_ = auVar56._0_4_;
      auVar75._8_4_ = auVar56._8_4_;
      auVar75._12_4_ = auVar56._8_4_;
      iVar79 = -(uint)(auVar41._4_4_ == iVar63);
      iVar83 = -(uint)(auVar41._12_4_ == iVar65);
      auVar21._4_4_ = iVar79;
      auVar21._0_4_ = iVar79;
      auVar21._8_4_ = iVar83;
      auVar21._12_4_ = iVar83;
      auVar82._4_4_ = auVar56._4_4_;
      auVar82._0_4_ = auVar56._4_4_;
      auVar82._8_4_ = auVar56._12_4_;
      auVar82._12_4_ = auVar56._12_4_;
      auVar41 = auVar21 & auVar75 | auVar82;
      auVar41 = packssdw(auVar41,auVar41);
      auVar8._8_4_ = 0xffffffff;
      auVar8._0_8_ = 0xffffffffffffffff;
      auVar8._12_4_ = 0xffffffff;
      auVar41 = packssdw(auVar41 ^ auVar8,auVar41 ^ auVar8);
      auVar41 = packsswb(auVar41,auVar41);
      if ((auVar41 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        *(undefined1 *)(puVar37 + 0x19) = 1;
      }
      auVar41 = pshufhw(auVar41,auVar75,0x84);
      auVar22._4_4_ = iVar79;
      auVar22._0_4_ = iVar79;
      auVar22._8_4_ = iVar83;
      auVar22._12_4_ = iVar83;
      auVar42 = pshufhw(auVar56,auVar22,0x84);
      auVar61 = pshufhw(auVar41,auVar82,0x84);
      auVar47._8_4_ = 0xffffffff;
      auVar47._0_8_ = 0xffffffffffffffff;
      auVar47._12_4_ = 0xffffffff;
      auVar47 = (auVar61 | auVar42 & auVar41) ^ auVar47;
      auVar41 = packssdw(auVar47,auVar47);
      auVar41 = packsswb(auVar41,auVar41);
      if ((auVar41._10_2_ >> 8 & 1) != 0) {
        *(undefined1 *)((long)puVar37 + 0x37) = 1;
      }
      auVar41 = (auVar58 | _DAT_002ca6f0) ^ auVar28;
      auVar57._0_4_ = -(uint)(iVar60 < auVar41._0_4_);
      auVar57._4_4_ = -(uint)(iVar63 < auVar41._4_4_);
      auVar57._8_4_ = -(uint)(iVar64 < auVar41._8_4_);
      auVar57._12_4_ = -(uint)(iVar65 < auVar41._12_4_);
      auVar23._4_4_ = auVar57._0_4_;
      auVar23._0_4_ = auVar57._0_4_;
      auVar23._8_4_ = auVar57._8_4_;
      auVar23._12_4_ = auVar57._8_4_;
      auVar42 = pshuflw(auVar82,auVar23,0xe8);
      auVar48._0_4_ = -(uint)(auVar41._0_4_ == iVar60);
      auVar48._4_4_ = -(uint)(auVar41._4_4_ == iVar63);
      auVar48._8_4_ = -(uint)(auVar41._8_4_ == iVar64);
      auVar48._12_4_ = -(uint)(auVar41._12_4_ == iVar65);
      auVar76._4_4_ = auVar48._4_4_;
      auVar76._0_4_ = auVar48._4_4_;
      auVar76._8_4_ = auVar48._12_4_;
      auVar76._12_4_ = auVar48._12_4_;
      auVar41 = pshuflw(auVar48,auVar76,0xe8);
      auVar77._4_4_ = auVar57._4_4_;
      auVar77._0_4_ = auVar57._4_4_;
      auVar77._8_4_ = auVar57._12_4_;
      auVar77._12_4_ = auVar57._12_4_;
      auVar61 = pshuflw(auVar57,auVar77,0xe8);
      auVar9._8_4_ = 0xffffffff;
      auVar9._0_8_ = 0xffffffffffffffff;
      auVar9._12_4_ = 0xffffffff;
      auVar41 = packssdw(auVar41 & auVar42,(auVar61 | auVar41 & auVar42) ^ auVar9);
      auVar41 = packsswb(auVar41,auVar41);
      if ((auVar41 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(undefined1 *)(puVar37 + 0x1e) = 1;
      }
      auVar24._4_4_ = auVar57._0_4_;
      auVar24._0_4_ = auVar57._0_4_;
      auVar24._8_4_ = auVar57._8_4_;
      auVar24._12_4_ = auVar57._8_4_;
      auVar77 = auVar76 & auVar24 | auVar77;
      auVar61 = packssdw(auVar77,auVar77);
      auVar10._8_4_ = 0xffffffff;
      auVar10._0_8_ = 0xffffffffffffffff;
      auVar10._12_4_ = 0xffffffff;
      auVar41 = packssdw(auVar41,auVar61 ^ auVar10);
      auVar41 = packsswb(auVar41,auVar41);
      if ((auVar41._12_2_ >> 8 & 1) != 0) {
        *(undefined1 *)((long)puVar37 + 0x41) = 1;
      }
      auVar41 = (auVar58 | _DAT_002ca6e0) ^ auVar28;
      auVar49._0_4_ = -(uint)(iVar60 < auVar41._0_4_);
      auVar49._4_4_ = -(uint)(iVar63 < auVar41._4_4_);
      auVar49._8_4_ = -(uint)(iVar64 < auVar41._8_4_);
      auVar49._12_4_ = -(uint)(iVar65 < auVar41._12_4_);
      auVar78._4_4_ = auVar49._0_4_;
      auVar78._0_4_ = auVar49._0_4_;
      auVar78._8_4_ = auVar49._8_4_;
      auVar78._12_4_ = auVar49._8_4_;
      auVar59._4_4_ = -(uint)(auVar41._4_4_ == iVar63);
      auVar59._12_4_ = -(uint)(auVar41._12_4_ == iVar65);
      auVar59._0_4_ = auVar59._4_4_;
      auVar59._8_4_ = auVar59._12_4_;
      auVar62._4_4_ = auVar49._4_4_;
      auVar62._0_4_ = auVar49._4_4_;
      auVar62._8_4_ = auVar49._12_4_;
      auVar62._12_4_ = auVar49._12_4_;
      auVar61 = auVar59 & auVar78 | auVar62;
      auVar41 = packssdw(auVar49,auVar61);
      auVar11._8_4_ = 0xffffffff;
      auVar11._0_8_ = 0xffffffffffffffff;
      auVar11._12_4_ = 0xffffffff;
      auVar41 = packssdw(auVar41 ^ auVar11,auVar41 ^ auVar11);
      auVar41 = packsswb(auVar41,auVar41);
      if ((auVar41 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(undefined1 *)(puVar37 + 0x23) = 1;
      }
      auVar41 = pshufhw(auVar41,auVar78,0x84);
      in_XMM2 = pshufhw(auVar61,auVar59,0x84);
      in_XMM2 = in_XMM2 & auVar41;
      auVar41 = pshufhw(auVar41,auVar62,0x84);
      auVar50._8_4_ = 0xffffffff;
      auVar50._0_8_ = 0xffffffffffffffff;
      auVar50._12_4_ = 0xffffffff;
      auVar50 = (auVar41 | in_XMM2) ^ auVar50;
      auVar41 = packssdw(auVar50,auVar50);
      auVar41 = packsswb(auVar41,auVar41);
      if ((auVar41._14_2_ >> 8 & 1) != 0) {
        *(undefined1 *)((long)puVar37 + 0x4b) = 1;
      }
      uVar39 = uVar39 + 0x10;
      puVar37 = puVar37 + 0x28;
    } while ((uVar1 + 0xf & 0xfffffff0) != uVar39);
  }
  pvVar33 = sp_;
  aVar25._4_4_ = local_70.val._4_4_;
  aVar25.obj = local_70.val.obj;
  pvVar34 = sp_ + 1;
  *(ulong *)sp_ = CONCAT44(local_70._4_4_,local_70.typ);
  sp_ = pvVar34;
  pvVar33->val = aVar25;
  if (0 < (int)uVar35) {
    local_58 = (long *)((long)&pCVar2[local_70.val.obj & 0xfff].ptr_ + 8);
    lVar38 = 2;
    uVar39 = 0;
    do {
      uVar39 = uVar39 + 1;
      local_50.typ = VM_INT;
      local_50.val.obj = (vm_obj_id_t)uVar39;
      vm_val_t::ll_index(self,&local_40,&local_50);
      CVmBifTADS::toString(&local_50,&local_40,radix,flags);
      vmb_put_dh((char *)(*local_58 + lVar38),&local_50);
      lVar38 = lVar38 + 5;
    } while (uVar35 != uVar39);
  }
  pvVar33 = local_60;
  join(local_60,&local_70,",",1);
  sp_ = sp_ + -1;
  pcVar36 = vm_val_t::get_as_string(pvVar33);
  return pcVar36;
}

Assistant:

const char *CVmObjList::list_to_string(
    VMG_ vm_val_t *retval, const vm_val_t *self, int radix, int flags)
{
    /* count our elements */
    int n = self->ll_length(vmg0_);

    /* create a list with the same number of elements */
    vm_val_t newlstval;
    newlstval.set_obj(create(vmg_ FALSE, n));
    CVmObjList *newlst = vm_objid_cast(CVmObjList, newlstval.val.obj);
    newlst->cons_clear();

    /* push the new list for gc protection */
    G_stk->push(&newlstval);

    /* set up the new list as self.mapAll({x: toString(x)}) */
    for (int i = 0 ; i < n ; ++i)
    {
        /* get this element of the old list */
        vm_val_t ele;
        self->ll_index(vmg_ &ele, i+1);

        /* convert it to a string */
        vm_val_t newele;
        CVmBifTADS::toString(vmg_ &newele, &ele, radix, flags);

        /* store the result in the new list */
        newlst->cons_set_element(i, &newele);
    }

    /* convert the new list to a string using the basic join with commas */
    join(vmg_ retval, &newlstval, ",", 1);

    /* discard gc protection */
    G_stk->discard(1);

    /* return the new string */
    return retval->get_as_string(vmg0_);
}


/* ------------------------------------------------------------------------ */
/*
 *   Property evaluator - generate (static property)
 */
int CVmObjList::static_getp_generate(VMG_ vm_val_t *retval, uint *in_argc)
{
    /* check arguments */
    uint argc = (in_argc == 0 ? 0 : *in_argc);
    static CVmNativeCodeDesc desc(2);
    if (get_prop_check_argc(retval, in_argc, &desc))
        return TRUE;

    /* get the callback function argument */
    vm_val_t *func = G_stk->get(0);

    /* make sure it's a function; set up a header pointer if it is */
    CVmFuncPtr funcdesc;
    if (!funcdesc.set(vmg_ func))
        err_throw(VMERR_BAD_TYPE_BIF);

    /* get the count */
    int32_t cnt = G_stk->get(1)->num_to_int(vmg0_);

    /* make sure it's not negative */
    if (cnt < 0)
        err_throw(VMERR_BAD_VAL_BIF);

    /* create the list */
    retval->set_obj(CVmObjList::create(vmg_ FALSE, cnt));
    CVmObjList *lst = (CVmObjList *)vm_objp(vmg_ retval->val.obj);

    /* push the list value for gc protection */
    G_stk->push(retval);

    /* zero the element count, so that the gc doesn't deref garbage */
    lst->cons_set_len(0);

    /* find out how many arguments the function wants */
    int fargc = funcdesc.is_varargs() ? -1 : funcdesc.get_max_argc();

    /* set up our recursive call descriptor */
    vm_rcdesc rc(vmg_ "List.generate",
                 CVmObjList::metaclass_reg_->get_class_obj(vmg0_),
                 PROPIDX_generate, func, argc);

    /* generate the elements */
    for (int i = 0 ; i < cnt ; ++i)
    {
        /* push the callback arguments */
        const int pushed_argc = 1;
        G_stk->push()->set_int(i+1);

        /* adjust the arguments for what the callback actually wants */
        int sent_argc = fargc < 0 || fargc > pushed_argc ? pushed_argc : fargc;

        /* call the callback */
        G_interpreter->call_func_ptr(vmg_ func, sent_argc, &rc, 0);

        /* discard excess arguments */
        G_stk->discard(pushed_argc - sent_argc);

        /* add the result to the list */
        lst->cons_set_len(i+1);
        lst->cons_set_element(i, G_interpreter->get_r0());
    }

    /* discard arguments and gc protection */
    G_stk->discard(argc + 1);

    /* handled */
    return TRUE;
}

/* ------------------------------------------------------------------------ */
/*
 *   Property evaluator: get the index of the element with the minimum value 
 */
int CVmObjList::getp_indexOfMin(VMG_ vm_val_t *retval,
                                const vm_val_t *self_val,
                                const char *lst, uint *in_argc)
{
    /* do the general calculation to select the minimum value ("-1") */
    vm_rcdesc rc(vmg_ "List.indexOfMin", self_val, 29, G_stk->get(0),
                 in_argc != 0 ? *in_argc : 0);
    return get_minmax(vmg_ retval, self_val, lst, in_argc, &rc, -1, TRUE);
}

/*
 *   Property evaluator: get the value of the element with the minimum value 
 */
int CVmObjList::getp_minVal(VMG_ vm_val_t *retval,
                            const vm_val_t *self_val,
                            const char *lst, uint *in_argc)
{
    /* do the general calculation to select the minimum value ("-1") */
    vm_rcdesc rc(vmg_ "List.minVal", self_val, 30, G_stk->get(0),
                 in_argc != 0 ? *in_argc : 0);
    return get_minmax(vmg_ retval, self_val, lst, in_argc, &rc, -1, FALSE);
}

/*
 *   Property evaluator: get the index of the element with the maximum value 
 */
int CVmObjList::getp_indexOfMax(VMG_ vm_val_t *retval,
                                const vm_val_t *self_val,
                                const char *lst, uint *in_argc)
{
    /* do the general calculation to select the maximum value ("+1") */
    vm_rcdesc rc(vmg_ "List.indexOfMax", self_val, 31, G_stk->get(0),
                 in_argc != 0 ? *in_argc : 0);
    return get_minmax(vmg_ retval, self_val, lst, in_argc, &rc, 1, TRUE);
}

/*
 *   Property evaluator: get the value of the element with the maximum value 
 */
int CVmObjList::getp_maxVal(VMG_ vm_val_t *retval,
                            const vm_val_t *self_val,
                            const char *lst, uint *in_argc)
{
    /* do the general calculation to select the maximum value ("+1") */
    vm_rcdesc rc(vmg_ "List.maxVal", self_val, 32, G_stk->get(0),
                 in_argc != 0 ? *in_argc : 0);
    return get_minmax(vmg_ retval, self_val, lst, in_argc, &rc, 1, FALSE);
}

/*
 *   General handling for minIndex, minVal, maxIndex, and maxVal.  This finds
 *   the highest/lowest value in the list, optionally mapped through a
 *   callback function.  Returns the winning element's index and value.
 *   
 *   'sense' is the sense of the search: -1 for minimum, 1 for maximum.
 *   'want_index' is true if 'retval' should be set to the index of the
 *   winning element, false if 'retval' should be set to the winning
 *   element's value.  
 */
int CVmObjList::get_minmax(VMG_ vm_val_t *retval,
                           const vm_val_t *self_val,
                           const char *lst, uint *in_argc,
                           const vm_rcdesc *rc, int sense, int want_index)
{
    /* check arguments */
    uint argc = (in_argc == 0 ? 0 : *in_argc);
    static CVmNativeCodeDesc desc(0, 1);
    if (get_prop_check_argc(retval, in_argc, &desc))
        return TRUE;

    /* make sure the 'func' argument is valid */
    const vm_val_t *cb = 0;
    if (argc >= 1)
    {
        cb = G_stk->get(0);
        if (!cb->is_func_ptr(vmg0_))
            err_throw(VMERR_BAD_TYPE_BIF);
    }

    /* push 'self' for gc protection */
    G_stk->push(self_val);

    /* if there are no elements, this is an error */
    int cnt = vmb_get_len(lst);
    if (cnt == 0)
        err_throw(VMERR_BAD_VAL_BIF);

    /* we don't have a winner yet */
    int winner_idx = 0;
    vm_val_t winner;

    /* run through the list */
    for (int i = 0 ; i < cnt ; ++i)
    {
        /* get this element */
        vm_val_t ele;
        get_element_const(lst, i, &ele);

        /* if there's a callback, invoke it */
        if (cb != 0)
        {
            /* invoke the callback with the element value as the argument */
            G_stk->push(&ele);
            G_interpreter->call_func_ptr(vmg_ cb, 1, rc, 0);

            /* use the result as the comparison value */
            ele = *G_interpreter->get_r0();
        }

        /* compare it to the winner so far, and keep the lower value */
        if (i == 0)
        {
            /* it's the first element, so it's the default winner so far */
            winner_idx = i;
            winner = ele;
        }
        else
        {
            /* compare it to the winner so far */
            int cmp = ele.compare_to(vmg_ &winner);

            /* keep it if it's the min/max so far */
            if ((sense > 0 && cmp > 0) || (sense < 0 && cmp < 0))
            {
                winner_idx = i;
                winner = ele;
            }
        }
    }

    /* remove gc protection and arguments */
    G_stk->discard(argc + 1);
    
    /* return the winning index (note: 1-based) or value, as desired */
    if (want_index)
        retval->set_int(winner_idx + 1);
    else
        *retval = winner;
        
    /* handled */
    return TRUE;
}



/* ------------------------------------------------------------------------ */
/*
 *   Constant-pool list object 
 */

/*
 *   create 
 */
vm_obj_id_t CVmObjListConst::create(VMG_ const char *const_ptr)
{
    /* create our new ID */
    vm_obj_id_t id = vm_new_id(vmg_ FALSE, FALSE, FALSE);

    /* create our list object, pointing directly to the constant pool */
    new (vmg_ id) CVmObjListConst(vmg_ const_ptr);

    /* return the new ID */
    return id;
}